

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlRemoveMin(NodeAVL *p)

{
  NodeAVL *pNVar1;
  long in_RDI;
  NodeAVL *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    local_8 = *(NodeAVL **)(in_RDI + 0x28);
  }
  else {
    pNVar1 = avlRemoveMin(in_stack_ffffffffffffffe8);
    *(NodeAVL **)(in_RDI + 0x20) = pNVar1;
    local_8 = avlBalance(in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

static
NodeAVL* avlRemoveMin( NodeAVL* p ){
    #ifdef DEBUG_AVL
      printf( "avlRemoveMin id=%d\n", p->id );
    #endif
    if( !p->left ) return p->right;
    p->left = avlRemoveMin( p->left );
    #ifdef DEBUG_AVL
      printf( "bude balance z avlRemoveMin id=%d\n", p->id );
    #endif
    return avlBalance( p );
}